

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_bitmap_add_checked(roaring_bitmap_t *r,uint32_t val)

{
  int iVar1;
  int iVar2;
  container_t *pcVar3;
  container_t *c;
  array_container_t *c_00;
  undefined4 in_ESI;
  roaring_array_t *in_RDI;
  container_t *container_1;
  array_container_t *newac;
  int newCardinality;
  container_t *container2;
  uint8_t newtypecode;
  int oldCardinality;
  container_t *container;
  _Bool result;
  uint8_t typecode;
  int i;
  uint16_t hb;
  roaring_array_t *in_stack_ffffffffffffffb8;
  roaring_array_t *in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc8;
  uint16_t in_stack_ffffffffffffffca;
  int32_t in_stack_ffffffffffffffcc;
  roaring_array_t *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar4;
  uint8_t typecode_00;
  undefined4 in_stack_ffffffffffffffdc;
  _Bool local_16;
  uint8_t local_15;
  int32_t local_14;
  undefined2 local_e;
  roaring_array_t *local_8;
  
  local_e = (undefined2)((uint)in_ESI >> 0x10);
  local_8 = in_RDI;
  local_14 = ra_get_index(in_stack_ffffffffffffffb8,0);
  if (local_14 < 0) {
    c_00 = array_container_create();
    pcVar3 = container_add((container_t *)
                           CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                           (uint16_t)((ulong)in_stack_ffffffffffffffd0 >> 0x30),
                           (uint8_t)((ulong)in_stack_ffffffffffffffd0 >> 0x28),
                           (uint8_t *)
                           CONCAT44(in_stack_ffffffffffffffcc,
                                    CONCAT22(in_stack_ffffffffffffffca,in_stack_ffffffffffffffc8)));
    ra_insert_new_key_value_at
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffca,c_00,
               (uint8_t)((ulong)pcVar3 >> 0x38));
    local_16 = true;
  }
  else {
    ra_unshare_container_at_index
              (in_stack_ffffffffffffffc0,(uint16_t)((ulong)in_stack_ffffffffffffffb8 >> 0x30));
    pcVar3 = ra_get_container_at_index(local_8,(uint16_t)local_14,&local_15);
    iVar1 = container_get_cardinality(in_stack_ffffffffffffffb8,'\0');
    uVar4 = CONCAT13(local_15,(int3)in_stack_ffffffffffffffd8);
    c = container_add((container_t *)CONCAT44(iVar1,uVar4),
                      (uint16_t)((ulong)in_stack_ffffffffffffffd0 >> 0x30),
                      (uint8_t)((ulong)in_stack_ffffffffffffffd0 >> 0x28),
                      (uint8_t *)
                      CONCAT44(in_stack_ffffffffffffffcc,
                               CONCAT22(in_stack_ffffffffffffffca,in_stack_ffffffffffffffc8)));
    typecode_00 = (uint8_t)((uint)uVar4 >> 0x18);
    if (c == pcVar3) {
      iVar2 = container_get_cardinality(in_stack_ffffffffffffffb8,'\0');
      local_16 = iVar1 != iVar2;
    }
    else {
      container_free(in_stack_ffffffffffffffc0,(uint8_t)((ulong)in_stack_ffffffffffffffb8 >> 0x38));
      ra_set_container_at_index(local_8,local_14,c,typecode_00);
      local_16 = true;
    }
  }
  return local_16;
}

Assistant:

bool roaring_bitmap_add_checked(roaring_bitmap_t *r, uint32_t val) {
    const uint16_t hb = val >> 16;
    const int i = ra_get_index(&r->high_low_container, hb);
    uint8_t typecode;
    bool result = false;
    if (i >= 0) {
        ra_unshare_container_at_index(&r->high_low_container, (uint16_t)i);
        container_t *container = ra_get_container_at_index(
            &r->high_low_container, (uint16_t)i, &typecode);

        const int oldCardinality =
            container_get_cardinality(container, typecode);

        uint8_t newtypecode = typecode;
        container_t *container2 =
            container_add(container, val & 0xFFFF, typecode, &newtypecode);
        if (container2 != container) {
            container_free(container, typecode);
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
            result = true;
        } else {
            const int newCardinality =
                container_get_cardinality(container, newtypecode);

            result = oldCardinality != newCardinality;
        }
    } else {
        array_container_t *newac = array_container_create();
        container_t *container =
            container_add(newac, val & 0xFFFF, ARRAY_CONTAINER_TYPE, &typecode);
        // we could just assume that it stays an array container
        ra_insert_new_key_value_at(&r->high_low_container, -i - 1, hb,
                                   container, typecode);
        result = true;
    }

    return result;
}